

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O1

void __thiscall CfdCoreManager_Destructor_Test::TestBody(CfdCoreManager_Destructor_Test *this)

{
  bool bVar1;
  CfdCoreManager *this_00;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  this_00 = (CfdCoreManager *)operator_new(0x50);
  cfd::core::CfdCoreManager::CfdCoreManager(this_00);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cfd::core::CfdCoreManager::GetSupportedFunction();
  local_28.data_ = (AssertHelperData *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_20,"object->GetSupportedFunction()","GetSupportedFunctionExpect()",
             (unsigned_long *)&local_30,(unsigned_long *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_manager.cpp"
               ,0x40,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  (**(code **)(*(long *)this_00 + 8))(this_00);
  return;
}

Assistant:

TEST(CfdCoreManager, Destructor) {
  CfdCoreManager* object = new CfdCoreManager();
  EXPECT_EQ(object->GetSupportedFunction(), GetSupportedFunctionExpect());
  delete object;
}